

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ConstraintBlockSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ConstraintBlockSyntax,slang::syntax::ConstraintBlockSyntax_const&>
          (BumpAllocator *this,ConstraintBlockSyntax *args)

{
  SyntaxNode *pSVar1;
  Info *pIVar2;
  size_t sVar3;
  undefined4 uVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  ConstraintBlockSyntax *pCVar8;
  
  pCVar8 = (ConstraintBlockSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ConstraintBlockSyntax *)this->endPtr < pCVar8 + 1) {
    pCVar8 = (ConstraintBlockSyntax *)allocateSlow(this,0x70,8);
  }
  else {
    this->head->current = (byte *)(pCVar8 + 1);
  }
  (pCVar8->super_ConstraintItemSyntax).super_SyntaxNode.previewNode =
       (args->super_ConstraintItemSyntax).super_SyntaxNode.previewNode;
  uVar4 = *(undefined4 *)&(args->super_ConstraintItemSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_ConstraintItemSyntax).super_SyntaxNode.parent;
  (pCVar8->super_ConstraintItemSyntax).super_SyntaxNode.kind =
       (args->super_ConstraintItemSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pCVar8->super_ConstraintItemSyntax).super_SyntaxNode.field_0x4 = uVar4;
  (pCVar8->super_ConstraintItemSyntax).super_SyntaxNode.parent = pSVar1;
  uVar5 = (args->openBrace).field_0x2;
  NVar6.raw = (args->openBrace).numFlags.raw;
  uVar7 = (args->openBrace).rawLen;
  pIVar2 = (args->openBrace).info;
  (pCVar8->openBrace).kind = (args->openBrace).kind;
  (pCVar8->openBrace).field_0x2 = uVar5;
  (pCVar8->openBrace).numFlags = (NumericTokenFlags)NVar6.raw;
  (pCVar8->openBrace).rawLen = uVar7;
  (pCVar8->openBrace).info = pIVar2;
  uVar4 = *(undefined4 *)&(args->items).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->items).super_SyntaxListBase.super_SyntaxNode.parent;
  (pCVar8->items).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->items).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pCVar8->items).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (pCVar8->items).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pCVar8->items).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->items).super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pCVar8->items).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005c8270;
  (pCVar8->items).super_SyntaxListBase.childCount = (args->items).super_SyntaxListBase.childCount;
  sVar3 = (args->items).super_span<slang::syntax::ConstraintItemSyntax_*,_18446744073709551615UL>.
          _M_extent._M_extent_value;
  (pCVar8->items).super_span<slang::syntax::ConstraintItemSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->items).super_span<slang::syntax::ConstraintItemSyntax_*,_18446744073709551615UL>.
       _M_ptr;
  (pCVar8->items).super_span<slang::syntax::ConstraintItemSyntax_*,_18446744073709551615UL>.
  _M_extent._M_extent_value = sVar3;
  (pCVar8->items).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005cba08;
  uVar5 = (args->closeBrace).field_0x2;
  NVar6.raw = (args->closeBrace).numFlags.raw;
  uVar7 = (args->closeBrace).rawLen;
  pIVar2 = (args->closeBrace).info;
  (pCVar8->closeBrace).kind = (args->closeBrace).kind;
  (pCVar8->closeBrace).field_0x2 = uVar5;
  (pCVar8->closeBrace).numFlags = (NumericTokenFlags)NVar6.raw;
  (pCVar8->closeBrace).rawLen = uVar7;
  (pCVar8->closeBrace).info = pIVar2;
  return pCVar8;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }